

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

int __thiscall testing::UnitTest::test_suite_to_run_count(UnitTest *this)

{
  int iVar1;
  
  iVar1 = internal::UnitTestImpl::test_suite_to_run_count(this->impl_);
  return iVar1;
}

Assistant:

int UnitTest::test_suite_to_run_count() const {
  return impl()->test_suite_to_run_count();
}